

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O3

void av1_nn_softmax(float *input,float *output,int n)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = *input;
  uVar2 = (ulong)(uint)n;
  if (1 < n) {
    uVar1 = 1;
    do {
      if (fVar4 <= input[uVar1]) {
        fVar4 = input[uVar1];
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  if (0 < n) {
    fVar5 = 0.0;
    uVar1 = 0;
    do {
      fVar3 = input[uVar1] - fVar4;
      if (fVar3 <= -10.0) {
        fVar3 = -10.0;
      }
      fVar3 = expf(fVar3);
      output[uVar1] = fVar3;
      fVar5 = fVar5 + fVar3;
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
    if (0 < n) {
      uVar1 = 0;
      do {
        output[uVar1] = output[uVar1] / fVar5;
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
  }
  return;
}

Assistant:

void av1_nn_softmax(const float *input, float *output, int n) {
  // Softmax function is invariant to adding the same constant
  // to all input values, so we subtract the maximum input to avoid
  // possible overflow.
  float max_input = input[0];
  for (int i = 1; i < n; i++) max_input = AOMMAX(max_input, input[i]);
  float sum_out = 0.0f;
  for (int i = 0; i < n; i++) {
    // Clamp to range [-10.0, 0.0] to prevent FE_UNDERFLOW errors.
    const float normalized_input = AOMMAX(input[i] - max_input, -10.0f);
    output[i] = expf(normalized_input);
    sum_out += output[i];
  }
  for (int i = 0; i < n; i++) output[i] /= sum_out;
}